

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraKateGenerator.cxx
# Opt level: O0

void __thiscall
cmExtraKateGenerator::CreateKateProjectFile(cmExtraKateGenerator *this,cmLocalGenerator *lg)

{
  byte bVar1;
  string *psVar2;
  ostream *poVar3;
  bool bVar4;
  string local_2d0;
  uint local_2b0;
  undefined1 local_2a0 [8];
  cmGeneratedFileStream fout;
  string filename;
  cmLocalGenerator *lg_local;
  cmExtraKateGenerator *this_local;
  
  psVar2 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_(lg);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[14]>
            ((string *)&fout.field_0x260,psVar2,(char (*) [14])"/.kateproject");
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_2a0,(string *)&fout.field_0x260,false,None);
  bVar1 = std::ios::operator!((ios *)(local_2a0 + (long)*(_func_int **)((long)local_2a0 + -0x18)));
  bVar4 = (bVar1 & 1) != 0;
  if (!bVar4) {
    poVar3 = std::operator<<((ostream *)local_2a0,"{\n\t\"name\": \"");
    poVar3 = std::operator<<(poVar3,(string *)&this->ProjectName);
    poVar3 = std::operator<<(poVar3,"\",\n\t\"directory\": \"");
    psVar2 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_(lg);
    poVar3 = std::operator<<(poVar3,(string *)psVar2);
    poVar3 = std::operator<<(poVar3,"\",\n\t\"files\": [ { ");
    GenerateFilesString_abi_cxx11_(&local_2d0,this,lg);
    poVar3 = std::operator<<(poVar3,(string *)&local_2d0);
    std::operator<<(poVar3,"} ],\n");
    std::__cxx11::string::~string((string *)&local_2d0);
    WriteTargets(this,lg,(cmGeneratedFileStream *)local_2a0);
    std::operator<<((ostream *)local_2a0,"}\n");
  }
  local_2b0 = (uint)bVar4;
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2a0);
  std::__cxx11::string::~string((string *)&fout.field_0x260);
  return;
}

Assistant:

void cmExtraKateGenerator::CreateKateProjectFile(
  const cmLocalGenerator& lg) const
{
  std::string filename = cmStrCat(lg.GetBinaryDirectory(), "/.kateproject");
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  /* clang-format off */
  fout <<
    "{\n"
    "\t\"name\": \"" << this->ProjectName << "\",\n"
    "\t\"directory\": \"" << lg.GetSourceDirectory() << "\",\n"
    "\t\"files\": [ { " << this->GenerateFilesString(lg) << "} ],\n";
  /* clang-format on */
  this->WriteTargets(lg, fout);
  fout << "}\n";
}